

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_> __thiscall
wabt::MakeUnique<wabt::ExceptionModuleField,wabt::Location>(wabt *this,Location *args)

{
  ExceptionModuleField *this_00;
  
  this_00 = (ExceptionModuleField *)operator_new(0x78);
  ExceptionModuleField::ExceptionModuleField(this_00,args,(string_view)ZEXT816(0));
  *(ExceptionModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}